

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O1

pair<unsigned_int,_unsigned_int>
kratos::compute_var_high_low
          (Var *root,
          vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          *index)

{
  uint uVar1;
  uint uVar2;
  pointer puVar3;
  pointer ppVar4;
  bool bVar5;
  pair<unsigned_int,_unsigned_int> pVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  undefined1 local_50 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> bases;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,
             (long)(root->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(root->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 2,
             (allocator_type *)
             ((long)&bases.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  puVar3 = (root->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = (long)(root->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 2;
  uVar14 = (uint)uVar7;
  if (0 < (int)uVar14) {
    lVar8 = (ulong)(uVar14 & 0x7fffffff) + 1;
    iVar9 = 1;
    do {
      *(uint32_t *)((long)local_50 + (lVar8 + -2) * 4) = root->var_width_ * iVar9;
      iVar9 = iVar9 * puVar3[lVar8 + -2];
      lVar8 = lVar8 + -1;
    } while (1 < lVar8);
  }
  ppVar4 = (index->
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar8 = (long)(index->
                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar4;
  uVar10 = lVar8 >> 3;
  uVar14 = 0;
  uVar15 = 0;
  uVar11 = 0;
  uVar12 = 0;
  do {
    if (uVar10 <= uVar11) break;
    uVar1 = ppVar4[uVar11].first;
    uVar2 = ppVar4[uVar11].second;
    if (uVar1 < uVar2 || uVar1 - uVar2 == 0) {
      if (((uVar1 == uVar2) && (uVar13 = (ulong)uVar12, uVar13 < uVar7)) && (1 < puVar3[uVar13])) {
        uVar14 = uVar14 + uVar2 * *(pointer)((long)local_50 + uVar13 * 4);
        iVar9 = *(pointer)((long)local_50 + uVar13 * 4) + uVar14;
        uVar12 = uVar12 + 1;
        goto LAB_0019adbc;
      }
      bVar5 = false;
    }
    else {
      iVar9 = root->var_width_ * *(pointer)((long)local_50 + (ulong)uVar12 * 4);
      uVar14 = uVar14 + uVar2 * iVar9;
      iVar9 = ((uVar1 - uVar2) + 1) * iVar9 + uVar14;
LAB_0019adbc:
      uVar15 = iVar9 - 1;
      uVar11 = uVar11 + 1;
      bVar5 = true;
    }
  } while (bVar5);
  if (uVar11 < uVar10) {
    do {
      uVar15 = uVar14;
      uVar14 = ppVar4[uVar11].second + uVar15;
      uVar11 = uVar11 + 1;
    } while (uVar10 != uVar11);
    uVar15 = uVar15 + *(int *)((long)ppVar4 + lVar8 + -8);
  }
  if (local_50 != (undefined1  [8])0x0) {
    operator_delete((void *)local_50,
                    (long)bases.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)local_50);
  }
  pVar6.second = uVar14;
  pVar6.first = uVar15;
  return pVar6;
}

Assistant:

std::pair<uint32_t, uint32_t> compute_var_high_low(
    const Var *root, const std::vector<std::pair<uint32_t, uint32_t>> &index) {
    // outer to inner
    // flatten the index
    auto const &var_sizes = root->size();
    std::vector<uint32_t> bases(var_sizes.size());
    uint32_t base = 1;
    for (int i = static_cast<int>(var_sizes.size()) - 1; i >= 0; i--) {
        bases[i] = base * root->var_width();
        base *= var_sizes[i];
    }

    uint32_t var_low = 0;
    uint32_t var_high = 0;
    uint32_t index_to_size = 0;
    uint64_t i = 0;
    while (i < index.size()) {
        auto const &[slice_high, slice_low] = index[i];
        if (slice_high > slice_low) {
            var_low += slice_low * bases[index_to_size] * root->var_width();
            var_high = var_low +
                       (slice_high - slice_low + 1) * bases[index_to_size] * root->var_width() - 1;
        } else if (slice_high == slice_low && index_to_size < var_sizes.size() &&
                   var_sizes[index_to_size] > 1) {
            var_low += slice_low * bases[index_to_size];
            var_high = var_low + (slice_high - slice_low + 1) * bases[index_to_size] - 1;
            index_to_size++;
        } else {
            break;
        }
        i++;
    }

    if (i < index.size()) {
        for (; i < index.size(); i++) {
            auto const &[slice_high, slice_low] = index[i];
            var_low += slice_low;
            var_high = var_low + (slice_high - slice_low);
        }
    }

    return {var_high, var_low};
}